

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

SyntaxTreeNode * __thiscall Parser::parseProgram(Parser *this,string *program)

{
  SyntaxTreeNode *current;
  string line;
  stringstream splitter;
  byte abStack_190 [360];
  
  current = (SyntaxTreeNode *)operator_new(0x48);
  (current->children).super__Vector_base<SyntaxTreeNode_*,_std::allocator<SyntaxTreeNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (current->children).super__Vector_base<SyntaxTreeNode_*,_std::allocator<SyntaxTreeNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (current->children).super__Vector_base<SyntaxTreeNode_*,_std::allocator<SyntaxTreeNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (current->data)._M_dataplus._M_p = (pointer)&(current->data).field_2;
  (current->data)._M_string_length = 0;
  (current->data).field_2._M_local_buf[0] = '\0';
  current->nonTerminal = 0x4ff7a;
  current->parent = (SyntaxTreeNode *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&splitter,(string *)program,_S_out|_S_in)
  ;
  while ((abStack_190[*(long *)(_splitter + -0x18)] & 2) == 0) {
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&splitter,(string *)&line);
    current = parseLine(this,&line,current);
    std::__cxx11::string::~string((string *)&line);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&splitter);
  return current;
}

Assistant:

SyntaxTreeNode *Parser::parseProgram(const std::string &program) {
    auto *programTree = new SyntaxTreeNode(PROGRAM);
    std::stringstream splitter(program);
    while (!splitter.eof()) {
        std::string line;
        getline(splitter, line);
        programTree = parseLine(line, programTree);
    }
    return programTree;
}